

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_dbpointer(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_oid_t *ooid;
  char *collection;
  bson_oid_t oid;
  
  bson_oid_init(&oid,0);
  uVar3 = bson_bcon_magic();
  uVar3 = bcon_new(0,"foo",uVar3,0xb,"collection",&oid,0);
  uVar4 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar3,"foo",uVar4,0xb,&collection,&ooid,0);
  if (cVar1 == '\0') {
    pcVar5 = "BCON_EXTRACT (bcon, \"foo\", BCONE_DBPOINTER (collection, ooid))";
    uVar3 = 0xaa;
  }
  else {
    iVar2 = strcmp(collection,"collection");
    if (iVar2 == 0) {
      cVar1 = bson_oid_equal(ooid,&oid);
      if (cVar1 != '\0') {
        bson_destroy(uVar3);
        return;
      }
      pcVar5 = "bson_oid_equal (ooid, &oid)";
      uVar3 = 0xad;
    }
    else {
      pcVar5 = "strcmp (collection, \"collection\") == 0";
      uVar3 = 0xac;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar3,"test_dbpointer",pcVar5);
  abort();
}

Assistant:

static void
test_dbpointer (void)
{
   const char *collection;
   bson_oid_t oid;
   const bson_oid_t *ooid;
   bson_t *bcon;

   bson_oid_init (&oid, NULL);

   bcon = BCON_NEW ("foo", BCON_DBPOINTER ("collection", &oid));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_DBPOINTER (collection, ooid)));

   BSON_ASSERT (strcmp (collection, "collection") == 0);
   BSON_ASSERT (bson_oid_equal (ooid, &oid));

   bson_destroy (bcon);
}